

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

TestCaseGroup * vkt::compute::createBasicComputeShaderTests(TestContext *testCtx)

{
  TestContext *testCtx_00;
  TestNode *pTVar1;
  BufferToBufferInvertTest *pBVar2;
  string *local_90 [2];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [32];
  undefined4 local_40;
  IVec3 local_3c;
  
  local_60._16_8_ = operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_60._16_8_,testCtx,"basic","Basic compute tests");
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"empty_shader","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Shader that does nothing","");
  testCtx_00 = *(TestContext **)(local_60._16_8_ + 8);
  pTVar1 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_90[0],
             (char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d221b0;
  pTVar1[1]._vptr_TestNode = (_func_int **)anon_unknown_0::EmptyShaderTest::createProgram;
  pTVar1[1].m_testCtx = (TestContext *)anon_unknown_0::EmptyShaderTest::createTest;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ubo_to_ssbo_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_60._24_8_ = 0x100000001;
  local_40 = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x100,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ubo_to_ssbo_single_group","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 2;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 4;
  local_60._24_8_ = 0x100000001;
  local_40 = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x400,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ubo_to_ssbo_multiple_invocations","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_60._24_8_ = 0x400000002;
  local_40 = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x400,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ubo_to_ssbo_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 4;
  local_3c.m_data[2] = 2;
  local_60._24_8_ = 0x200000002;
  local_40 = 4;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x400,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"copy_ssbo_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_60._24_8_ = 0x100000001;
  local_40 = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x100,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"copy_ssbo_multiple_invocations","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_60._24_8_ = 0x400000002;
  local_40 = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x400,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"copy_ssbo_multiple_groups","")
  ;
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 4;
  local_3c.m_data[2] = 2;
  local_60._24_8_ = 0x200000002;
  local_40 = 4;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,local_90[0],(string *)local_70._M_allocated_capacity,0x400,&local_3c,
                      (IVec3 *)(local_60 + 0x18));
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,(TestNode *)pBVar2);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ssbo_rw_single_invocation","")
  ;
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Read and write same SSBO","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32920;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 1;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar1[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ssbo_rw_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Read and write same SSBO","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32920;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 1;
  pTVar1[1].m_testCtx = (TestContext *)0x400000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar1[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ssbo_unsized_arr_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Read and write same SSBO","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32920;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 0;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar1[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ssbo_unsized_arr_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Read and write same SSBO","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32920;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 0;
  pTVar1[1].m_testCtx = (TestContext *)0x400000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar1[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"write_multiple_arr_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d329c0;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 1;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar1[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"write_multiple_arr_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d329c0;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 1;
  pTVar1[1].m_testCtx = (TestContext *)0x400000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar1[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"write_multiple_unsized_arr_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d329c0;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 0;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar1[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"write_multiple_unsized_arr_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d329c0;
  *(undefined4 *)&pTVar1[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar1[1]._vptr_TestNode + 4) = 0;
  pTVar1[1].m_testCtx = (TestContext *)0x400000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar1[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ssbo_local_barrier_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO local barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32a60;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ssbo_local_barrier_single_group","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO local barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32a60;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar1[1].m_testCtx = (TestContext *)0x100000005;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"ssbo_local_barrier_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO local barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32a60;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar1[1].m_testCtx = (TestContext *)0x200000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ssbo_cmd_barrier_single","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO memory barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32b00;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  *(undefined4 *)&pTVar1[1].m_testCtx = 1;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ssbo_cmd_barrier_multiple","")
  ;
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO memory barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32b00;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x50000000b;
  *(undefined4 *)&pTVar1[1].m_testCtx = 7;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_var_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ba0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"shared_var_single_group","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ba0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar1[1].m_testCtx = (TestContext *)0x100000005;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_var_multiple_invocations","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ba0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x200000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x400000005;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_var_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ba0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar1[1].m_testCtx = (TestContext *)0x200000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_atomic_op_single_invocation","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32c40;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x100000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_atomic_op_single_group","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32c40;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar1[1].m_testCtx = (TestContext *)0x100000005;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_atomic_op_multiple_invocations","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32c40;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x200000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x400000005;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x88);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"shared_atomic_op_multiple_groups","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32c40;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar1[1].m_testCtx = (TestContext *)0x200000001;
  pTVar1[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"copy_image_to_ssbo_small","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Image to SSBO copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ce0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x4000000040;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"copy_image_to_ssbo_large","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Image to SSBO copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ce0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x400000002;
  pTVar1[1].m_testCtx = (TestContext *)0x20000000200;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"copy_ssbo_to_image_small","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO to image copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32d80;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar1[1].m_testCtx = (TestContext *)0x4000000040;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"copy_ssbo_to_image_large","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"SSBO to image copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32d80;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x400000002;
  pTVar1[1].m_testCtx = (TestContext *)0x20000000200;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"image_atomic_op_local_size_1","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with image","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32e20;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x4000000001;
  *(undefined4 *)&pTVar1[1].m_testCtx = 0x40;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x80);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"image_atomic_op_local_size_8","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"Atomic operation with image","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32e20;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x4000000008;
  *(undefined4 *)&pTVar1[1].m_testCtx = 0x40;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x78);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"image_barrier_single","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"Image barrier","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ec0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x100000001;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  pTVar1 = (TestNode *)operator_new(0x78);
  local_90[0] = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"image_barrier_multiple","");
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"Image barrier","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,testCtx,(char *)local_90[0],(char *)local_70._M_allocated_capacity);
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d32ec0;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x4000000040;
  tcu::TestNode::addChild((TestNode *)local_60._16_8_,pTVar1);
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60._0_8_ + 1));
  }
  if (local_90[0] != (string *)local_80) {
    operator_delete(local_90[0],(ulong)(local_80._0_8_ + 1));
  }
  return (TestCaseGroup *)(TestNode *)local_60._16_8_;
}

Assistant:

tcu::TestCaseGroup* createBasicComputeShaderTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicComputeTests(new tcu::TestCaseGroup(testCtx, "basic", "Basic compute tests"));

	addFunctionCaseWithPrograms(basicComputeTests.get(), "empty_shader", "Shader that does nothing", EmptyShaderTest::createProgram, EmptyShaderTest::createTest);

	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_invocation",	"Copy from UBO to SSBO, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_group",			"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(2,1,4),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_invocations",	"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_groups",		"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_single_invocation",		"Copy between SSBOs, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_invocations",	"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_groups",		"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_single_invocation",			"Read and write same SSBO",		256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_multiple_groups",				"Read and write same SSBO",		1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_single_invocation",	"Read and write same SSBO",		256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_multiple_groups",		"Read and write same SSBO",		1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_single_invocation",			"Write to multiple SSBOs",	256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_multiple_groups",			"Write to multiple SSBOs",	1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_single_invocation",	"Write to multiple SSBOs",	256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_multiple_groups",	"Write to multiple SSBOs",	1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_invocation",	"SSBO local barrier usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_group",		"SSBO local barrier usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_multiple_groups",	"SSBO local barrier usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_single",		"SSBO memory barrier usage",	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_multiple",	"SSBO memory barrier usage",	tcu::IVec3(11,5,7)));

	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_invocation",		"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_group",			"Basic shared variable usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_invocations",	"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_groups",		"Basic shared variable usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_invocation",		"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_group",			"Atomic operation with shared var",		tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_invocations",	"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_groups",			"Atomic operation with shared var",		tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_small",	"Image to SSBO copy",	tcu::IVec2(1,1),	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_large",	"Image to SSBO copy",	tcu::IVec2(2,4),	tcu::IVec2(512,512)));

	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_small",	"SSBO to image copy",	tcu::IVec2(1, 1),	tcu::IVec2(64, 64)));
	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_large",	"SSBO to image copy",	tcu::IVec2(2, 4),	tcu::IVec2(512, 512)));

	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_1",	"Atomic operation with image",	1,	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_8",	"Atomic operation with image",	8,	tcu::IVec2(64,64)));

	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_single",		"Image barrier",	tcu::IVec2(1,1)));
	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_multiple",	"Image barrier",	tcu::IVec2(64,64)));

	return basicComputeTests.release();
}